

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cxx
# Opt level: O0

int write_declare(char *format,...)

{
  int iVar1;
  included *this;
  included **ppiStack_440;
  int i;
  included **p;
  char buf [1024];
  va_list args;
  char *format_local;
  
  buf[0x3fc] = '0';
  buf[0x3fd] = '\0';
  buf[0x3fe] = '\0';
  buf[0x3ff] = '\0';
  buf[0x3f8] = '\b';
  buf[0x3f9] = '\0';
  buf[0x3fa] = '\0';
  buf[0x3fb] = '\0';
  vsnprintf((char *)&p,0x400,format,buf + 0x3f8);
  ppiStack_440 = &included_root;
  while( true ) {
    if (*ppiStack_440 == (included *)0x0) {
      fprintf((FILE *)header_file,"%s\n");
      this = (included *)operator_new(0x18);
      included::included(this,(char *)&p);
      *ppiStack_440 = this;
      return 1;
    }
    iVar1 = strcmp((char *)&p,(*ppiStack_440)->text);
    if (iVar1 == 0) break;
    if (iVar1 < 0) {
      ppiStack_440 = &(*ppiStack_440)->left;
    }
    else {
      ppiStack_440 = &(*ppiStack_440)->right;
    }
  }
  return 0;
}

Assistant:

int write_declare(const char *format, ...) {
  va_list args;
  char buf[1024];
  va_start(args, format);
  vsnprintf(buf, sizeof(buf), format, args);
  va_end(args);
  included **p = &included_root;
  while (*p) {
    int i = strcmp(buf,(*p)->text);
    if (!i) return 0;
    else if (i < 0) p = &((*p)->left);
    else p  = &((*p)->right);
  }
  fprintf(header_file,"%s\n",buf);
  *p = new included(buf);
  return 1;
}